

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

void __thiscall Minisat::Solver::setDecisionVar(Solver *this,Var v,bool b)

{
  char *pcVar1;
  undefined3 in_register_00000011;
  long lStack_30;
  
  pcVar1 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                     (&(this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,v);
  if (CONCAT31(in_register_00000011,b) == 0) {
    if (*pcVar1 == '\0') goto LAB_0010e129;
    lStack_30 = -1;
  }
  else {
    if (*pcVar1 != '\0') goto LAB_0010e129;
    lStack_30 = 1;
  }
  this->dec_vars = this->dec_vars + lStack_30;
LAB_0010e129:
  pcVar1 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                     (&(this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,v);
  *pcVar1 = b;
  insertVarOrder(this,v);
  return;
}

Assistant:

inline void     Solver::setDecisionVar(Var v, bool b) 
{ 
    if      ( b && !decision[v]) dec_vars++;
    else if (!b &&  decision[v]) dec_vars--;

    decision[v] = b;
    insertVarOrder(v);
}